

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O3

void unit_div(void)

{
  unit *puVar1;
  long lVar2;
  
  puVar1 = usp;
  if (UnitsOn != '\x01') {
    return;
  }
  if (unit_stack < usp) {
    if ((usp[-1].isnum == 0) || (usp->isnum == 0)) {
      usp[-1].isnum = 0;
    }
    lVar2 = -0x10;
    do {
      puVar1->dim[lVar2 + -8] = puVar1->dim[lVar2 + -8] - puVar1[1].dim[lVar2 + -8];
      lVar2 = lVar2 + 1;
    } while (lVar2 != -6);
    puVar1[-1].factor = puVar1[-1].factor / puVar1->factor;
    unit_pop();
    return;
  }
  __assert_fail("usp > unit_stack",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                ,0x137,"void unit_div()");
}

Assistant:

void unit_div() {
	/* divide next element by top of stack and leave on stack */
	struct unit *up;
	int i;
	
	IFUNITS
	assert(usp > unit_stack);
	check_num();
	up = usp -1;
	for (i=0; i<NDIM; i++) {
		up->dim[i] -= usp->dim[i];
	}
	up->factor /= usp->factor;
	unit_pop();
}